

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          BaseTextGenerator *generator)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  double dVar3;
  uint uVar4;
  FastFieldValuePrinter *pFVar5;
  Message *message_00;
  uint64_t uVar6;
  string *this_00;
  EnumDescriptor *this_01;
  EnumValueDescriptor *pEVar7;
  _func_int *UNRECOVERED_JUMPTABLE;
  long *plVar8;
  Nonnull<char_*> pcVar9;
  Nonnull<const_char_*> pcVar10;
  Nonnull<const_char_*> extraout_RAX;
  bool bVar11;
  long *plVar12;
  long lVar13;
  FieldDescriptor *message_01;
  ulong uVar14;
  _Alloc_hider _Var15;
  float fVar16;
  string_view str;
  string scratch;
  string truncated_value;
  string local_c0;
  string local_90;
  LogMessageFatal local_70;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  bVar2 = field->field_0x1;
  bVar11 = (bool)((bVar2 & 0x20) >> 5);
  if (0xbf < bVar2 == bVar11) {
    pcVar10 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        (bVar11,0xbf < bVar2,
                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar10 == (Nonnull<const_char_*>)0x0) {
    if ((index != -1) && ((field->field_0x1 & 0x20) == 0)) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                 ,0xa90,"field->is_repeated() || (index == -1)");
      str._M_str = "Index must be -1 for non-repeated fields";
      str._M_len = 0x28;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)&local_c0,str);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_c0);
    }
    message_01 = field;
    pFVar5 = GetFieldPrinter(this,field);
    bVar11 = TryRedactFieldValue(this,(Message *)message_01,field,generator,false);
    if (bVar11) {
      return;
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
    case 1:
      bVar2 = field->field_0x1;
      bVar11 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar11) {
        pcVar10 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar11,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar10 == (Nonnull<const_char_*>)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          uVar4 = Reflection::GetInt32(reflection,message,field);
        }
        else {
          uVar4 = Reflection::GetRepeatedInt32(reflection,message,field,index);
        }
        UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[3];
LAB_002ba0e8:
        uVar14 = (ulong)uVar4;
LAB_002ba172:
        (*UNRECOVERED_JUMPTABLE)(pFVar5,uVar14,generator,UNRECOVERED_JUMPTABLE);
        return;
      }
      goto LAB_002ba528;
    case 2:
      bVar2 = field->field_0x1;
      bVar11 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar11) {
        pcVar10 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar11,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar10 == (Nonnull<const_char_*>)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          uVar6 = Reflection::GetInt64(reflection,message,field);
        }
        else {
          uVar6 = Reflection::GetRepeatedInt64(reflection,message,field,index);
        }
        UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[5];
LAB_002ba10a:
        (*UNRECOVERED_JUMPTABLE)(pFVar5,uVar6,generator,UNRECOVERED_JUMPTABLE);
        return;
      }
      goto LAB_002ba535;
    case 3:
      bVar2 = field->field_0x1;
      bVar11 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar11) {
        pcVar10 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar11,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar10 == (Nonnull<const_char_*>)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          uVar4 = Reflection::GetUInt32(reflection,message,field);
        }
        else {
          uVar4 = Reflection::GetRepeatedUInt32(reflection,message,field,index);
        }
        UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[4];
        goto LAB_002ba0e8;
      }
      goto LAB_002ba501;
    case 4:
      bVar2 = field->field_0x1;
      bVar11 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar11) {
        pcVar10 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar11,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar10 == (Nonnull<const_char_*>)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          uVar6 = Reflection::GetUInt64(reflection,message,field);
        }
        else {
          uVar6 = Reflection::GetRepeatedUInt64(reflection,message,field,index);
        }
        UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[6];
        goto LAB_002ba10a;
      }
      goto LAB_002ba50e;
    case 5:
      bVar2 = field->field_0x1;
      bVar11 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar11) {
        pcVar10 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar11,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar10 == (Nonnull<const_char_*>)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          dVar3 = Reflection::GetDouble(reflection,message,field);
          fVar16 = SUB84(dVar3,0);
        }
        else {
          dVar3 = Reflection::GetRepeatedDouble(reflection,message,field,index);
          fVar16 = SUB84(dVar3,0);
        }
        UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[8];
LAB_002ba13e:
        (*UNRECOVERED_JUMPTABLE)(fVar16,pFVar5,generator);
        return;
      }
      goto LAB_002ba4e7;
    case 6:
      bVar2 = field->field_0x1;
      bVar11 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar11) {
        pcVar10 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar11,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar10 == (Nonnull<const_char_*>)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          fVar16 = Reflection::GetFloat(reflection,message,field);
        }
        else {
          fVar16 = Reflection::GetRepeatedFloat(reflection,message,field,index);
        }
        UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[7];
        goto LAB_002ba13e;
      }
      goto LAB_002ba542;
    case 7:
      bVar2 = field->field_0x1;
      bVar11 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar11) {
        pcVar10 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar11,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar10 == (Nonnull<const_char_*>)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          bVar11 = Reflection::GetBool(reflection,message,field);
        }
        else {
          bVar11 = Reflection::GetRepeatedBool(reflection,message,field,index);
        }
        UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[2];
        uVar14 = (ulong)bVar11;
        goto LAB_002ba172;
      }
      break;
    case 8:
      bVar2 = field->field_0x1;
      bVar11 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar11) {
        pcVar10 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar11,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar10 == (Nonnull<const_char_*>)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          uVar4 = Reflection::GetEnumValue(reflection,message,field);
        }
        else {
          uVar4 = Reflection::GetRepeatedEnumValue(reflection,message,field,index);
        }
        this_01 = FieldDescriptor::enum_type(field);
        pEVar7 = EnumDescriptor::FindValueByNumber(this_01,uVar4);
        if (pEVar7 != (EnumValueDescriptor *)0x0) {
          (*pFVar5->_vptr_FastFieldValuePrinter[0xb])
                    (pFVar5,(ulong)uVar4,pEVar7->all_names_,generator);
          return;
        }
        paVar1 = &local_c0.field_2;
        pcVar9 = absl::lts_20250127::numbers_internal::FastIntToBuffer(uVar4,paVar1->_M_local_buf);
        local_c0._M_dataplus._M_p = pcVar9 + -(long)paVar1;
        local_c0._M_string_length = (size_type)paVar1;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,paVar1,pcVar9);
        (*pFVar5->_vptr_FastFieldValuePrinter[0xb])(pFVar5,(ulong)uVar4,&local_90,generator);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p == &local_90.field_2) {
          return;
        }
        lVar13 = CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                          local_90.field_2._M_local_buf[0]);
        _Var15._M_p = local_90._M_dataplus._M_p;
        goto LAB_002ba349;
      }
      goto LAB_002ba51b;
    case 9:
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      local_c0._M_string_length = 0;
      local_c0.field_2._M_local_buf[0] = '\0';
      bVar2 = field->field_0x1;
      bVar11 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar11) {
        pcVar10 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar11,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar10 != (Nonnull<const_char_*>)0x0) goto LAB_002ba55c;
      if ((field->field_0x1 & 0x20) == 0) {
        this_00 = Reflection::GetStringReference(reflection,message,field,&local_c0);
      }
      else {
        this_00 = Reflection::GetRepeatedStringReference(reflection,message,field,index,&local_c0);
      }
      paVar1 = &local_90.field_2;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      local_90._M_dataplus._M_p = (pointer)paVar1;
      if ((0 < this->truncate_string_field_longer_than_) &&
         ((ulong)this->truncate_string_field_longer_than_ < this_00->_M_string_length)) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)this_00);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_50);
        plVar12 = plVar8 + 2;
        if ((long *)*plVar8 == plVar12) {
          local_60 = *plVar12;
          lStack_58 = plVar8[3];
          local_70.super_LogMessage._0_8_ = &local_60;
        }
        else {
          local_60 = *plVar12;
          local_70.super_LogMessage._0_8_ = (long *)*plVar8;
        }
        local_70.super_LogMessage.data_._M_t.
        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        ._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
              )plVar8[1];
        *plVar8 = (long)plVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        this_00 = &local_90;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_70);
        if ((long *)local_70.super_LogMessage._0_8_ != &local_60) {
          operator_delete((void *)local_70.super_LogMessage._0_8_,local_60 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      bVar2 = field->type_;
      lVar13 = 0x48;
      if (bVar2 != 9) {
        if (bVar2 == 0xc) {
          pcVar10 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              ((ulong)bVar2,0xc,"field->type() == FieldDescriptor::TYPE_BYTES");
        }
        lVar13 = 0x50;
        if (pcVar10 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_70,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                     ,0xabf,pcVar10);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_70);
        }
      }
      (**(code **)((long)pFVar5->_vptr_FastFieldValuePrinter + lVar13))(pFVar5,this_00,generator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
        return;
      }
      lVar13 = CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                        local_c0.field_2._M_local_buf[0]);
      _Var15._M_p = local_c0._M_dataplus._M_p;
LAB_002ba349:
      operator_delete(_Var15._M_p,lVar13 + 1);
switchD_002b9d39_default:
      return;
    case 10:
      bVar2 = field->field_0x1;
      bVar11 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar11) {
        pcVar10 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar11,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar10 == (Nonnull<const_char_*>)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
        }
        else {
          message_00 = Reflection::GetRepeatedMessage(reflection,message,field,index);
        }
        Print(this,message_00,generator);
        return;
      }
      goto LAB_002ba4f4;
    default:
      goto switchD_002b9d39_default;
    }
  }
  else {
    PrintFieldValue();
LAB_002ba4e7:
    PrintFieldValue();
LAB_002ba4f4:
    PrintFieldValue();
LAB_002ba501:
    PrintFieldValue();
LAB_002ba50e:
    PrintFieldValue();
LAB_002ba51b:
    PrintFieldValue();
LAB_002ba528:
    PrintFieldValue();
LAB_002ba535:
    PrintFieldValue();
LAB_002ba542:
    PrintFieldValue();
  }
  PrintFieldValue();
  pcVar10 = extraout_RAX;
LAB_002ba55c:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb54,pcVar10);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_90);
}

Assistant:

void TextFormat::Printer::PrintFieldValue(const Message& message,
                                          const Reflection* reflection,
                                          const FieldDescriptor* field,
                                          int index,
                                          BaseTextGenerator* generator) const {
  ABSL_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);
  if (TryRedactFieldValue(message, field, generator,
                          /*insert_value_separator=*/false)) {
    return;
  }

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                           \
    printer->Print##METHOD(                                          \
        field->is_repeated()                                         \
            ? reflection->GetRepeated##METHOD(message, field, index) \
            : reflection->Get##METHOD(message, field),               \
        generator);                                                  \
    break

    OUTPUT_FIELD(INT32, Int32);
    OUTPUT_FIELD(INT64, Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD(FLOAT, Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(BOOL, Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      std::string scratch;
      const std::string& value =
          field->is_repeated()
              ? reflection->GetRepeatedStringReference(message, field, index,
                                                       &scratch)
              : reflection->GetStringReference(message, field, &scratch);
      const std::string* value_to_print = &value;
      std::string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          static_cast<size_t>(truncate_string_field_longer_than_) <
              value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        printer->PrintString(*value_to_print, generator);
      } else {
        ABSL_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        printer->PrintBytes(*value_to_print, generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value =
          field->is_repeated()
              ? reflection->GetRepeatedEnumValue(message, field, index)
              : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != nullptr) {
        printer->PrintEnum(enum_value, internal::NameOfEnumAsString(enum_desc),
                           generator);
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        printer->PrintEnum(enum_value, absl::StrCat(enum_value), generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
                ? reflection->GetRepeatedMessage(message, field, index)
                : reflection->GetMessage(message, field),
            generator);
      break;
  }
}